

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySubImage3D::testTexSubImage3D
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth,
          SubImage3DCopyParams *copy_params,GLboolean *test_passed)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  clearCubeMapArrayTexture(this,width,height,depth,0);
  texSubImage3D(this,copy_params,
                (this->m_copy_data_buffer).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start);
  bVar2 = checkResults(this,width,height,depth);
  if (!bVar2) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glTexSubImage3D failed to copy data to texture cube map array\'s data store from client\'s memory\n"
               ,0x60);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Texture Cube Map Array Dimensions (width, height, depth) ",0x39);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) ",0x3b)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Texture Cube Map Array Copy Size (width, height, depth) ",0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    *test_passed = '\0';
  }
  clearCubeMapArrayTexture(this,width,height,depth,0);
  (**(code **)(lVar5 + 0x40))(0x88ec,this->m_pixel_buffer_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x1ef);
  texSubImage3D(this,copy_params,(GLuint *)0x0);
  bVar2 = checkResults(this,width,height,depth);
  if (!bVar2) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glTexSubImage3D failed to copy data to texture cube map array\'s data store from GL_PIXEL_UNPACK_BUFFER\n"
               ,0x67);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Texture Cube Map Array Dimensions (width, height, depth) ",0x39);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) ",0x3b)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Texture Cube Map Array Copy Size (width, height, depth) ",0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    *test_passed = '\0';
  }
  (**(code **)(lVar5 + 0x40))(0x88ec,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                  ,0x205);
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::testTexSubImage3D(glw::GLuint width, glw::GLuint height, glw::GLuint depth,
													  const SubImage3DCopyParams& copy_params,
													  glw::GLboolean&			  test_passed)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	clearCubeMapArrayTexture(width, height, depth, 0);

	texSubImage3D(copy_params, &m_copy_data_buffer[0]);

	if (!checkResults(width, height, depth))
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "glTexSubImage3D failed to copy data to texture cube map array's data store from client's memory\n"
			<< "Texture Cube Map Array Dimensions (width, height, depth) "
			<< "(" << width << "," << height << "," << depth << ")\n"
			<< "Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) "
			<< "(" << copy_params.m_xoffset << "," << copy_params.m_yoffset << "," << copy_params.m_zoffset << ")\n"
			<< "Texture Cube Map Array Copy Size (width, height, depth) "
			<< "(" << copy_params.m_width << "," << copy_params.m_height << "," << copy_params.m_depth << ")\n"
			<< tcu::TestLog::EndMessage;

		test_passed = false;
	}

	clearCubeMapArrayTexture(width, height, depth, 0);

	gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_pixel_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");

	texSubImage3D(copy_params, 0);

	if (!checkResults(width, height, depth))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glTexSubImage3D failed to copy data to texture cube map "
													   "array's data store from GL_PIXEL_UNPACK_BUFFER\n"
						   << "Texture Cube Map Array Dimensions (width, height, depth) "
						   << "(" << width << "," << height << "," << depth << ")\n"
						   << "Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) "
						   << "(" << copy_params.m_xoffset << "," << copy_params.m_yoffset << ","
						   << copy_params.m_zoffset << ")\n"
						   << "Texture Cube Map Array Copy Size (width, height, depth) "
						   << "(" << copy_params.m_width << "," << copy_params.m_height << "," << copy_params.m_depth
						   << ")\n"
						   << tcu::TestLog::EndMessage;

		test_passed = false;
	}

	gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
}